

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_member(CTcPrsNode *lhs)

{
  tc_toktyp_t tVar1;
  CTcToken *pCVar2;
  CTcPrsNode *pCVar3;
  CTPNArglist *pCVar4;
  CTcPrsNode *in_RDI;
  CTPNArglist *arglist;
  int rhs_is_expr;
  CTcPrsNode *rhs;
  int in_stack_ffffffffffffff6c;
  CTcTokenizer *in_stack_ffffffffffffff70;
  CTcTokenizer *in_stack_ffffffffffffff78;
  CTPNMember *in_stack_ffffffffffffff80;
  CTcPrsOpBin *in_stack_ffffffffffffff88;
  CTPNMemArg *in_stack_ffffffffffffff90;
  CTcPrsNode *local_8;
  
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x25910e);
  if (tVar1 == TOKT_DOT) {
    CTcTokenizer::next(in_stack_ffffffffffffff78);
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x259140);
    if (tVar1 == TOKT_SYM) {
      CTcPrsAllocObj::operator_new(0x259178);
      pCVar2 = CTcTokenizer::getcur(G_tok);
      CTcToken::get_text(pCVar2);
      pCVar2 = CTcTokenizer::getcur(G_tok);
      in_stack_ffffffffffffff90 = (CTPNMemArg *)CTcToken::get_text_len(pCVar2);
      CTPNSym::CTPNSym((CTPNSym *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                       (size_t)in_stack_ffffffffffffff70);
      CTcTokenizer::next(in_stack_ffffffffffffff78);
    }
    else if (tVar1 == TOKT_LPAR) {
      CTcTokenizer::next(in_stack_ffffffffffffff78);
      pCVar3 = CTcPrsOpBin::parse(in_stack_ffffffffffffff88);
      if (pCVar3 == (CTcPrsNode *)0x0) {
        return (CTcPrsNode *)0x0;
      }
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x25927a);
      if (tVar1 == TOKT_RPAR) {
        CTcTokenizer::next(in_stack_ffffffffffffff78);
      }
      else {
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2592b3);
        if (tVar1 == TOKT_SEM) {
          return in_RDI;
        }
        tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2592c7);
        if (tVar1 == TOKT_EOF) {
          return in_RDI;
        }
      }
    }
    else {
      if (tVar1 != TOKT_TARGETPROP) {
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        CTcTokenizer::next(in_stack_ffffffffffffff78);
        return in_RDI;
      }
      CTcTokenizer::next(in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff88 = (CTcPrsOpBin *)CTcPrsAllocObj::operator_new(0x259301);
      memset(in_stack_ffffffffffffff88,0,8);
      CTPNTargetprop::CTPNTargetprop((CTPNTargetprop *)in_stack_ffffffffffffff70);
      CTcParser::set_full_method_ctx_referenced(G_prs,1);
    }
  }
  else {
    in_stack_ffffffffffffff80 = (CTPNMember *)CTcPrsAllocObj::operator_new(0x25938e);
    memset(in_stack_ffffffffffffff80,0,8);
    CTPNTargetprop::CTPNTargetprop((CTPNTargetprop *)in_stack_ffffffffffffff70);
    CTcParser::set_full_method_ctx_referenced(G_prs,1);
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2593e4);
  if (tVar1 == TOKT_LPAR) {
    pCVar4 = parse_arg_list();
    if (pCVar4 == (CTPNArglist *)0x0) {
      local_8 = (CTcPrsNode *)0x0;
    }
    else {
      local_8 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x25941a);
      CTPNMemArg::CTPNMemArg
                (in_stack_ffffffffffffff90,(CTcPrsNode *)in_stack_ffffffffffffff88,
                 (CTcPrsNode *)in_stack_ffffffffffffff80,(int)((ulong)local_8 >> 0x20),
                 (CTPNArglist *)in_stack_ffffffffffffff70);
    }
  }
  else {
    local_8 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x25947d);
    CTPNMember::CTPNMember
              (in_stack_ffffffffffffff80,(CTcPrsNode *)in_stack_ffffffffffffff78,local_8,
               in_stack_ffffffffffffff6c);
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_member(CTcPrsNode *lhs)
{
    CTcPrsNode *rhs;
    int rhs_is_expr;

    /*
     *   If a '.' is present, skip it; otherwise, '.targetprop' is implied. 
     */
    if (G_tok->cur() == TOKT_DOT)
    {
        /* we have an explicit property expression - skip the '.' */
        G_tok->next();

        /* assume the property will be a simple symbol, not an expression */
        rhs_is_expr = FALSE;

        /* we could have a symbol or a parenthesized expression */
        switch(G_tok->cur())
        {
        case TOKT_SYM:
            /* 
             *   It's a simple property name - create a symbol node.  Note
             *   that we must explicitly create an unresolved symbol node,
             *   since we want to ignore any local variable with the same
             *   name and look only in the global symbol table for a
             *   property; we must hence defer resolving the symbol until
             *   code generation.  
             */
            rhs = new CTPNSym(G_tok->getcur()->get_text(),
                              G_tok->getcur()->get_text_len());
            
            /* skip the symbol token */
            G_tok->next();
            
            /* proceed to check for an argument list */
            break;
            
        case TOKT_LPAR:
            /* 
             *   It's a parenthesized expression - parse it.  First, skip
             *   the open paren - we don't want the sub-expression to go
             *   beyond the close paren (if we didn't skip the open paren,
             *   the open paren would be part of the sub-expression, hence
             *   any postfix expression after the close paren would be
             *   considered part of the sub-expression; this would be
             *   invalid, since we might want to find a postfix actual
             *   parameter list).  
             */
            G_tok->next();
            
            /* remember that it's an expression */
            rhs_is_expr = TRUE;
            
            /* parse the sub-expression */
            rhs = S_op_comma.parse();
            if (rhs == 0)
                return 0;
            
            /* require the close paren */
            if (G_tok->cur() == TOKT_RPAR)
            {
                /* skip the closing paren */
                G_tok->next();
            }
            else
            {
                /* log the error */
                G_tok->log_error_curtok(TCERR_EXPR_MISSING_RPAR);
                
                /* 
                 *   if we're at a semicolon or end of file, we must be on
                 *   to the next statement - stop trying to parse this one
                 *   if so; otherwise, continue on the assumption that they
                 *   merely left out the close paren and what follows is
                 *   more expression for us to process 
                 */
                if (G_tok->cur() == TOKT_SEM || G_tok->cur() == TOKT_EOF)
                    return lhs;
            }
            break;
            
        case TOKT_TARGETPROP:
            /* 
             *   it's an unparenthesized "targetprop" expression - skip the
             *   keyword 
             */
            G_tok->next();
            
            /* 
             *   the property value is the result of evaluating
             *   "targetprop", which is an expression 
             */
            rhs = new CTPNTargetprop();
            rhs_is_expr = TRUE;

            /* note the reference to the extended method context */
            G_prs->set_full_method_ctx_referenced(TRUE);

            /* go parse the rest */
            break;
            
        default:
            /* anything else is invalid - log an error */
            G_tok->log_error_curtok(TCERR_INVALID_PROP_EXPR);
            
            /* skip the errant token so we don't loop on it */
            G_tok->next();
            
            /* return what we have so far */
            return lhs;
        }
    }
    else
    {
        /* there's no property specified, so '.targetprop' is implied */
        rhs = new CTPNTargetprop();
        rhs_is_expr = TRUE;

        /* 
         *   note the reference to the full method context (since
         *   'targetprop' is part of the extended method context beyond
         *   'self') 
         */
        G_prs->set_full_method_ctx_referenced(TRUE);
    }
        
    /* check for an argument list */
    if (G_tok->cur() == TOKT_LPAR)
    {
        CTPNArglist *arglist;
        
        /* parse the argument list */
        arglist = parse_arg_list();
        if (arglist == 0)
            return 0;

        /* create and return a member-with-arguments node */
        return new CTPNMemArg(lhs, rhs, rhs_is_expr, arglist);
    }
    else
    {
        /* 
         *   there's no argument list - create and return a simple member
         *   node 
         */
        return new CTPNMember(lhs, rhs, rhs_is_expr);
    }
}